

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection1-client.c
# Opt level: O0

void ssh1mainchan_request_x11_forwarding
               (SshChannel *sc,_Bool want_reply,char *authproto,char *authdata,int screen_number,
               _Bool oneshot)

{
  PktOut *pPVar1;
  PktOut *pktout;
  ssh1_connection_state *s;
  _Bool oneshot_local;
  int screen_number_local;
  char *authdata_local;
  char *authproto_local;
  _Bool want_reply_local;
  SshChannel *sc_local;
  
  pPVar1 = ssh_bpp_new_pktout((BinaryPacketProtocol *)sc[0xd].cl,0x22);
  BinarySink_put_stringz(pPVar1->binarysink_,authproto);
  BinarySink_put_stringz(pPVar1->binarysink_,authdata);
  if (((ulong)sc[-1].vt & 1) != 0) {
    BinarySink_put_uint32(pPVar1->binarysink_,(long)screen_number);
  }
  pq_base_push((PacketQueueBase *)sc[0xe].cl,&pPVar1->qnode);
  ssh1mainchan_queue_response((ssh1_connection_state *)(sc + -2),want_reply,false);
  return;
}

Assistant:

static void ssh1mainchan_request_x11_forwarding(
    SshChannel *sc, bool want_reply, const char *authproto,
    const char *authdata, int screen_number, bool oneshot)
{
    struct ssh1_connection_state *s =
        container_of(sc, struct ssh1_connection_state, mainchan_sc);
    PktOut *pktout;

    pktout = ssh_bpp_new_pktout(s->ppl.bpp, SSH1_CMSG_X11_REQUEST_FORWARDING);
    put_stringz(pktout, authproto);
    put_stringz(pktout, authdata);
    if (s->local_protoflags & SSH1_PROTOFLAG_SCREEN_NUMBER)
        put_uint32(pktout, screen_number);
    pq_push(s->ppl.out_pq, pktout);

    ssh1mainchan_queue_response(s, want_reply, false);
}